

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void DefineStyleRules(TidyDocImpl *doc,Node *node)

{
  AttVal *attr;
  ctmbstr str;
  AttVal *classattr;
  tmbstr ptVar1;
  Node *node_00;
  
  node_00 = node->content;
  if (node_00 != (Node *)0x0) {
    for (; node_00 != (Node *)0x0; node_00 = node_00->next) {
      DefineStyleRules(doc,node_00);
    }
  }
  attr = prvTidyAttrGetById(node,TidyAttr_STYLE);
  if (attr == (AttVal *)0x0) {
    return;
  }
  if (attr->value != (ctmbstr)0x0) {
    str = FindStyle(doc,node->element,attr->value);
    classattr = prvTidyAttrGetById(node,TidyAttr_CLASS);
    if (classattr == (AttVal *)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,attr->attribute);
      (*doc->allocator->vtbl->free)(doc->allocator,attr->value);
      ptVar1 = prvTidytmbstrdup(doc->allocator,"class");
      attr->attribute = ptVar1;
      ptVar1 = prvTidytmbstrdup(doc->allocator,str);
      attr->value = ptVar1;
      return;
    }
    prvTidyAppendToClassAttr(doc,classattr,str);
  }
  prvTidyRemoveAttribute(doc,node,attr);
  return;
}

Assistant:

static void DefineStyleRules( TidyDocImpl* doc, Node *node )
{
    Node *child;

    if (node->content)
    {
        for (child = node->content;
                child != NULL; child = child->next)
        {
            DefineStyleRules( doc, child );
        }
    }

    Style2Rule( doc, node );
}